

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

void __thiscall webrtc::Matrix<std::complex<float>_>::Resize(Matrix<std::complex<float>_> *this)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            (&this->data_,this->num_columns_ * this->num_rows_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::resize
            (&this->elements_,this->num_rows_);
  uVar1 = this->num_rows_;
  sVar2 = this->num_columns_;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    (this->elements_).
    super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] =
         (complex<float> *)
         ((long)&((this->data_).
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar3);
    lVar3 = lVar3 + sVar2 * 8;
  }
  return;
}

Assistant:

void Resize() {
    size_t size = num_rows_ * num_columns_;
    data_.resize(size);
    elements_.resize(num_rows_);

    for (size_t i = 0; i < num_rows_; ++i) {
      elements_[i] = &data_[i * num_columns_];
    }
  }